

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

void __thiscall sf::priv::ClipboardImpl::processEvent(ClipboardImpl *this,XEvent *windowEvent)

{
  int iVar1;
  _Alloc_hider _Var2;
  undefined4 uVar3;
  pointer puVar4;
  reference pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  uchar *puVar8;
  size_type sVar9;
  int *in_RSI;
  undefined8 *in_RDI;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  data_2;
  string data_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> targets;
  XSelectionEvent selectionEvent_1;
  XSelectionRequestEvent *selectionRequestEvent;
  int result;
  uchar *data;
  unsigned_long remainingBytes;
  unsigned_long items;
  int format;
  Atom type;
  XSelectionEvent *selectionEvent;
  value_type_conflict5 *in_stack_fffffffffffffd28;
  String *right;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd30;
  String *this_00;
  undefined4 uVar10;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *this_01;
  value_type_conflict5 *in_stack_fffffffffffffd38;
  allocator<char> *__a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd40;
  uchar *__beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  undefined8 uVar12;
  string *in_stack_fffffffffffffd78;
  undefined8 uVar13;
  locale *in_stack_fffffffffffffd80;
  String *in_stack_fffffffffffffd88;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_1b8;
  locale local_198 [8];
  string local_190 [32];
  undefined8 local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  undefined4 local_150 [8];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  int *local_108;
  locale local_100 [15];
  allocator<char> local_f1;
  string local_f0 [119];
  allocator<char> local_79;
  string local_78 [36];
  int local_54;
  undefined1 local_50 [32];
  String local_30;
  
  iVar1 = *in_RSI;
  if (iVar1 != 0x1d) {
    if (iVar1 == 0x1e) {
      local_150[0] = 0x1f;
      local_130 = *(undefined8 *)(in_RSI + 10);
      local_128 = *(undefined8 *)(in_RSI + 0xc);
      local_118 = *(undefined8 *)(in_RSI + 0x10);
      local_110 = *(undefined8 *)(in_RSI + 0x12);
      if (*(long *)(in_RSI + 0xc) == in_RDI[2]) {
        local_108 = in_RSI;
        if (*(long *)(in_RSI + 0xe) == in_RDI[3]) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1953a9);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          local_170 = 0x1f;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          uVar3 = (undefined4)((ulong)in_stack_fffffffffffffd30 >> 0x20);
          if (in_RDI[5] != 0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          }
          uVar12 = in_RDI[1];
          uVar13 = *(undefined8 *)(local_108 + 10);
          uVar11 = *(undefined8 *)(local_108 + 0x10);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_168,0);
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_168);
          XChangeProperty(uVar12,uVar13,uVar11,4,0x20,0,pvVar5,CONCAT44(uVar3,(int)sVar6));
          local_120 = in_RDI[3];
          XSendEvent(in_RDI[1],*(undefined8 *)(local_108 + 10),1,0,local_150);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (in_stack_fffffffffffffd40);
          return;
        }
        if ((*(long *)(in_RSI + 0xe) == 0x1f) ||
           ((in_RDI[5] == 0 && (*(long *)(in_RSI + 0xe) == in_RDI[4])))) {
          std::locale::locale(local_198);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffd30 >> 0x20);
          String::toAnsiString_abi_cxx11_(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
          std::locale::~locale(local_198);
          uVar12 = in_RDI[1];
          uVar13 = *(undefined8 *)(local_108 + 10);
          uVar11 = *(undefined8 *)(local_108 + 0x10);
          uVar7 = std::__cxx11::string::c_str();
          uVar3 = std::__cxx11::string::size();
          XChangeProperty(uVar12,uVar13,uVar11,0x1f,8,0,uVar7,CONCAT44(uVar10,uVar3));
          local_120 = 0x1f;
          XSendEvent(in_RDI[1],*(undefined8 *)(local_108 + 10),1,0,local_150);
          std::__cxx11::string::~string(local_190);
          return;
        }
        if ((in_RDI[5] != 0) &&
           ((*(long *)(in_RSI + 0xe) == in_RDI[5] || (*(long *)(in_RSI + 0xe) == in_RDI[4])))) {
          String::toUtf8_abi_cxx11_(in_stack_fffffffffffffd88);
          uVar3 = (undefined4)((ulong)in_stack_fffffffffffffd30 >> 0x20);
          uVar12 = *(undefined8 *)(local_108 + 10);
          uVar13 = *(undefined8 *)(local_108 + 0x10);
          uVar11 = in_RDI[1];
          uVar7 = in_RDI[5];
          puVar8 = std::__cxx11::
                   basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   ::c_str((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                            *)0x1957b0);
          sVar9 = std::__cxx11::
                  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                  ::size(&local_1b8);
          this_01 = (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                     *)CONCAT44(uVar3,(int)sVar9);
          XChangeProperty(uVar11,uVar12,uVar13,uVar7,8,0,puVar8);
          local_120 = in_RDI[5];
          XSendEvent(in_RDI[1],*(undefined8 *)(local_108 + 10),1,0,local_150);
          std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::~basic_string(this_01);
          return;
        }
      }
      local_120 = *(undefined8 *)(in_RSI + 0xe);
      local_118 = 0;
      XSendEvent(in_RDI[1],*(undefined8 *)(in_RSI + 10),1,0,local_150);
    }
    else if (((iVar1 == 0x1f) &&
             (local_30.m_string._M_string_length = (size_type)in_RSI,
             String::clear((String *)0x194efb),
             *(long *)(local_30.m_string._M_string_length + 0x38) != 0)) &&
            (*(long *)(local_30.m_string._M_string_length + 0x28) == in_RDI[2])) {
      local_50._0_8_ = 0;
      this_00 = &local_30;
      __a = (allocator<char> *)(local_50 + 0x1c);
      puVar8 = local_50 + 0x10;
      __beg = local_50 + 8;
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
      right = (String *)0x0;
      local_54 = XGetWindowProperty(in_RDI[1],*in_RDI,in_RDI[6],0,0x7fffffff,0);
      _Var2._M_p = local_30.m_string._M_dataplus._M_p;
      if (local_54 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                   in_stack_fffffffffffffd60);
        puVar4 = (pointer)getAtom(in_stack_fffffffffffffd68,
                                  SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator(&local_79);
        if (_Var2._M_p != puVar4) {
          if ((local_30.m_string._M_dataplus._M_p == (pointer)in_RDI[5]) && (local_50._28_4_ == 8))
          {
            String::fromUtf8<unsigned_char*>
                      ((uchar *)in_stack_fffffffffffffd88,(uchar *)in_stack_fffffffffffffd80);
            String::operator=(this_00,right);
            String::~String((String *)0x1950c2);
          }
          else if ((local_30.m_string._M_dataplus._M_p == (pointer)0x1f) && (local_50._28_4_ == 8))
          {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<unsigned_char*,void>(this_02,__beg,puVar8,__a);
            std::locale::locale(local_100);
            String::String((String *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           (locale *)in_stack_fffffffffffffd70);
            String::operator=(this_00,right);
            String::~String((String *)0x19520e);
            std::locale::~locale(local_100);
            std::__cxx11::string::~string(local_f0);
            std::allocator<char>::~allocator(&local_f1);
          }
        }
        XFree(local_50._0_8_);
        XDeleteProperty(in_RDI[1],*in_RDI,in_RDI[6]);
      }
      *(undefined1 *)(in_RDI + 0x15) = 1;
    }
  }
  return;
}

Assistant:

void ClipboardImpl::processEvent(XEvent& windowEvent)
{
    switch (windowEvent.type)
    {
        case SelectionClear:
        {
            // We don't have any resources we need to clean up
            // when losing selection ownership so we don't do
            // anything when we receive SelectionClear
            // We will still respond to any future SelectionRequest
            // events since doing so doesn't really do any harm
            break;
        }
        case SelectionNotify:
        {
            // Notification that the current selection owner
            // has responded to our request

            XSelectionEvent& selectionEvent = *reinterpret_cast<XSelectionEvent*>(&windowEvent.xselection);

            m_clipboardContents.clear();

            // If retrieving the selection fails or conversion is unsuccessful
            // we leave the contents of the clipboard empty since we don't
            // own it and we don't know what it could currently be
            if ((selectionEvent.property == None) || (selectionEvent.selection != m_clipboard))
                break;

            Atom type;
            int format;
            unsigned long items;
            unsigned long remainingBytes;
            unsigned char* data = 0;

            // The selection owner should have wrote the selection
            // data to the specified window property
            int result = XGetWindowProperty(
                m_display,
                m_window,
                m_targetProperty,
                0,
                0x7fffffff,
                False,
                AnyPropertyType,
                &type,
                &format,
                &items,
                &remainingBytes,
                &data
            );

            if (result == Success)
            {
                // We don't support INCR for now
                // It is very unlikely that this will be returned
                // for purely text data transfer anyway
                if (type != getAtom("INCR", false))
                {
                    // Only copy the data if the format is what we expect
                    if ((type == m_utf8String) && (format == 8))
                    {
                        m_clipboardContents = String::fromUtf8(data, data + items);
                    }
                    else if ((type == XA_STRING) && (format == 8))
                    {
                        // Convert from ANSI std::string to sf::String
                        m_clipboardContents = std::string(data, data + items);
                    }
                }

                XFree(data);

                // The selection requestor must always delete the property themselves
                XDeleteProperty(m_display, m_window, m_targetProperty);
            }

            m_requestResponded = true;

            break;
        }
        case SelectionRequest:
        {
            // Respond to a request for our clipboard contents
            XSelectionRequestEvent& selectionRequestEvent = *reinterpret_cast<XSelectionRequestEvent*>(&windowEvent.xselectionrequest);

            // Our reply
            XSelectionEvent selectionEvent;

            selectionEvent.type      = SelectionNotify;
            selectionEvent.requestor = selectionRequestEvent.requestor;
            selectionEvent.selection = selectionRequestEvent.selection;
            selectionEvent.property  = selectionRequestEvent.property;
            selectionEvent.time      = selectionRequestEvent.time;

            if (selectionRequestEvent.selection == m_clipboard)
            {
                if (selectionRequestEvent.target == m_targets)
                {
                    // Respond to a request for our valid conversion targets
                    std::vector<Atom> targets;

                    targets.push_back(m_targets);
                    targets.push_back(m_text);
                    targets.push_back(XA_STRING);

                    if (m_utf8String != None)
                        targets.push_back(m_utf8String);

                    XChangeProperty(
                        m_display,
                        selectionRequestEvent.requestor,
                        selectionRequestEvent.property,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        reinterpret_cast<unsigned char*>(&targets[0]),
                        targets.size()
                    );

                    // Notify the requestor that they can read the targets from their window property
                    selectionEvent.target = m_targets;

                    XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

                    break;
                }
                else if ((selectionRequestEvent.target == XA_STRING) || ((m_utf8String == None) && (selectionRequestEvent.target == m_text)))
                {
                    // Respond to a request for conversion to a Latin-1 string
                    std::string data = m_clipboardContents.toAnsiString();

                    XChangeProperty(
                        m_display,
                        selectionRequestEvent.requestor,
                        selectionRequestEvent.property,
                        XA_STRING,
                        8,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(data.c_str()),
                        data.size()
                    );

                    // Notify the requestor that they can read the data from their window property
                    selectionEvent.target = XA_STRING;

                    XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

                    break;
                }
                else if ((m_utf8String != None) && ((selectionRequestEvent.target == m_utf8String) || (selectionRequestEvent.target == m_text)))
                {
                    // Respond to a request for conversion to a UTF-8 string
                    // or an encoding of our choosing (we always choose UTF-8)
                    std::basic_string<Uint8> data = m_clipboardContents.toUtf8();

                    XChangeProperty(
                        m_display,
                        selectionRequestEvent.requestor,
                        selectionRequestEvent.property,
                        m_utf8String,
                        8,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(data.c_str()),
                        data.size()
                    );

                    // Notify the requestor that they can read the data from their window property
                    selectionEvent.target = m_utf8String;

                    XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

                    break;
                }
            }

            // Notify the requestor that we could not respond to their request
            selectionEvent.target = selectionRequestEvent.target;
            selectionEvent.property = None;

            XSendEvent(m_display, selectionRequestEvent.requestor, True, NoEventMask, reinterpret_cast<XEvent*>(&selectionEvent));

            break;
        }
        default:
            break;
    }
}